

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Size size,x86Reg index
                     ,int multiplier,x86Reg base,uint shift)

{
  ArgType AVar1;
  x86Instruction *pxVar2;
  x86Argument arg;
  uint uVar3;
  int iVar4;
  x86Reg xVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  x86Reg xVar9;
  x86Argument *this;
  long lVar10;
  int multiplier_local;
  x86Reg index_local;
  x86Argument address;
  
  multiplier_local = multiplier;
  index_local = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation
              (ctx,&index_local,&multiplier_local,&base,&shift);
    ctx->genRegRead[base] = true;
    ctx->genRegRead[index_local] = true;
  }
  xVar5 = index_local;
  iVar4 = multiplier_local;
  uVar3 = shift;
  xVar9 = base;
  address.type = argPtr;
  uVar8 = (ulong)(op - o_cvttsd2si);
  address.field_1.ptrSize = size;
  address.ptrBase = base;
  address.ptrIndex = index_local;
  address.ptrMult = multiplier_local;
  address.ptrNum = shift;
  if (op - o_cvttsd2si < 0x21) {
    if ((0x170e00001U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 != 0x13) {
        if (uVar8 != 0x1f) goto LAB_001b9463;
LAB_001b9588:
        CodeGenGenericContext::MemRead(ctx,&address);
        ctx->genRegRead[reg1] = true;
        goto LAB_001b952e;
      }
LAB_001b95c2:
      if (ctx->skipTracking == false) {
        uVar7 = CodeGenGenericContext::MemFind(ctx,&address);
        if (uVar7 != 0) {
          uVar7 = uVar7 - 1;
          AVar1 = ctx->memCache[uVar7].value.type;
          if (AVar1 == argNumber) {
            EMIT_OP_REG_NUM(ctx,op,reg1,ctx->memCache[uVar7].value.field_1.labelID);
            return;
          }
          if (AVar1 == argReg) {
            if (ctx->memCache[uVar7].address.field_1.reg != (op != o_mov) + rECX) {
              __assert_fail("ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                            ,0x5dc,
                            "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                           );
            }
            xVar9 = ctx->memCache[uVar7].value.field_1.reg;
LAB_001b9672:
            EMIT_OP_REG_REG(ctx,op,reg1,xVar9);
            return;
          }
        }
        this = ctx->genReg;
        for (lVar10 = 0; lVar10 != 0x11; lVar10 = lVar10 + 1) {
          if ((this->type == argPtr) && (bVar6 = x86Argument::operator==(this,&address), bVar6)) {
            EMIT_OP_REG_REG(ctx,op,reg1,(x86Reg)lVar10);
            return;
          }
          this = this + 1;
        }
        CodeGenGenericContext::MemRead(ctx,&address);
        if (xVar5 == reg1 || xVar9 == reg1) {
          CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
        }
        else {
          arg._4_4_ = address._4_4_;
          arg.type = address.type;
          arg.field_1.imm64Arg._4_4_ = address.field_1.imm64Arg._4_4_;
          arg.field_1.reg = address.field_1.reg;
          arg.ptrIndex = address.ptrIndex;
          arg.ptrBase = address.ptrBase;
          arg.ptrNum = address.ptrNum;
          arg.ptrMult = address.ptrMult;
          CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
        }
      }
      goto LAB_001b952e;
    }
  }
  else {
LAB_001b9463:
    if (2 < op - o_and) {
      if ((op == o_movsxd) || (op == o_movsx)) {
        CodeGenGenericContext::MemRead(ctx,&address);
        CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
        goto LAB_001b952e;
      }
      if (op == o_lea) {
        if (index_local != rNONE || shift != 0) {
          CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
          goto LAB_001b952e;
        }
        op = o_mov64;
        goto LAB_001b9672;
      }
      if (((op != o_add) && (op != o_sub)) && (op != o_imul)) {
        if (op == o_cmp) goto LAB_001b9588;
        if (op != o_mov) {
          __assert_fail("!\"unknown instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x622,
                        "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                       );
        }
        goto LAB_001b95c2;
      }
    }
  }
  CodeGenGenericContext::MemRead(ctx,&address);
  CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
LAB_001b952e:
  pxVar2 = ctx->x86Op;
  pxVar2->name = op;
  (pxVar2->argA).type = argReg;
  (pxVar2->argA).field_1.reg = reg1;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).type = argPtr;
  (pxVar2->argB).field_1.ptrSize = size;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).ptrIndex = xVar5;
  (pxVar2->argB).ptrMult = iVar4;
  (pxVar2->argB).ptrBase = xVar9;
  (pxVar2->argB).ptrNum = uVar3;
  ctx->x86Op = pxVar2 + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument address = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		if(unsigned memIndex = ctx.MemFind(address))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD));

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
			else if(ctx.memCache[memIndex].value.type == x86Argument::argNumber)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.memCache[memIndex].value.num);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(ctx.genReg[i].type == x86Argument::argPtr && ctx.genReg[i] == address)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86Reg)i);
				return;
			}
		}

		ctx.MemRead(address);

		// If write doesn't invalidate the source registers, mark that register contains value from source address
		if(reg1 != base && reg1 != index)
			ctx.OverwriteRegisterWithValue(reg1, address);
		else
			ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movsx:
	case o_movsxd:
		ctx.MemRead(address);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_lea:
		if(index == rNONE && shift == 0)
		{
			EMIT_OP_REG_REG(ctx, sizeof(void*) == 8 ? o_mov64 : o_mov, reg1, base);
			return;
		}

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvttsd2si:
	case o_cvttsd2si64:
	case o_add:
	case o_sub:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(address);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(address);

		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}